

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O1

bool protobuf_test_messages_proto2_TestAllTypesProto2_map_string_nested_message_next
               (protobuf_test_messages_proto2_TestAllTypesProto2 *msg,upb_StringView *key,
               protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage **val,size_t *iter)

{
  anon_union_8_2_9eb4e620_for_upb_Message_0 map;
  _Bool _Var1;
  upb_MessageValue v;
  upb_MessageValue k;
  upb_MessageValue local_30;
  upb_MessageValue local_20;
  
  map = (anon_union_8_2_9eb4e620_for_upb_Message_0)
        ((anon_union_8_2_9eb4e620_for_upb_Message_0 *)(msg + 0x4e))->internal_opaque;
  if (((ulong)map & 1) == 0) {
    if (map == (anon_union_8_2_9eb4e620_for_upb_Message_0)0x0) {
      _Var1 = false;
    }
    else {
      _Var1 = upb_Map_Next((upb_Map *)map,&local_20,&local_30,iter);
      if (_Var1) {
        key->data = (char *)local_20.double_val;
        key->size = local_20.str_val.size;
        *val = (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *)local_30.double_val
        ;
      }
    }
    return _Var1;
  }
  __assert_fail("!upb_TaggedMessagePtr_IsEmpty(tagged)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x1ac,
                "void _upb_Message_AssertMapIsUntagged_dont_copy_me__upb_internal_use_only(const struct upb_Message *, const upb_MiniTableField *)"
               );
}

Assistant:

UPB_INLINE bool protobuf_test_messages_proto2_TestAllTypesProto2_map_string_nested_message_next(const protobuf_test_messages_proto2_TestAllTypesProto2* msg, upb_StringView* key, const protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage** val,
                           size_t* iter) {
  const upb_MiniTableField field = {71, UPB_SIZE(208, 624), 0, 20, 11, (int)kUpb_FieldMode_Map | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&protobuf_0test_0messages__proto2__TestAllTypesProto2__MapStringNestedMessageEntry_msg_init);
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&protobuf_0test_0messages__proto2__TestAllTypesProto2__NestedMessage_msg_init);
  const upb_Map* map = upb_Message_GetMap(UPB_UPCAST(msg), &field);
  if (!map) return false;
  upb_MessageValue k;
  upb_MessageValue v;
  if (!upb_Map_Next(map, &k, &v, iter)) return false;
  memcpy(key, &k, sizeof(*key));
  memcpy(val, &v, sizeof(*val));
  return true;
}